

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall rw::TexDictionary::streamWrite(TexDictionary *this,Stream *stream)

{
  LLLink *pLVar1;
  uint32 uVar2;
  int32 iVar3;
  int iVar4;
  LLLink *pLVar5;
  Texture *this_00;
  
  uVar2 = streamGetSize(this);
  writeChunkHeader(stream,0x16,uVar2);
  writeChunkHeader(stream,1,4);
  iVar3 = LinkList::count(&this->textures);
  Stream::writeI16(stream,(int16)iVar3);
  Stream::writeI16(stream,0);
  pLVar5 = (this->textures).link.next;
  while (pLVar5 != &(this->textures).link) {
    pLVar1 = pLVar5->next;
    this_00 = (Texture *)(pLVar5 + -1);
    uVar2 = Texture::streamGetSizeNative(this_00);
    iVar4 = PluginList::streamGetSize((PluginList *)&Texture::s_plglist,this_00);
    writeChunkHeader(stream,0x15,uVar2 + iVar4 + 0xc);
    Texture::streamWriteNative(this_00,stream);
    PluginList::streamWrite((PluginList *)&Texture::s_plglist,stream,this_00);
    pLVar5 = pLVar1;
  }
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return;
}

Assistant:

void
TexDictionary::streamWrite(Stream *stream)
{
	writeChunkHeader(stream, ID_TEXDICTIONARY, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, 4);
	int32 numTex = this->count();
	stream->writeI16(numTex);
	stream->writeI16(0);
	FORLIST(lnk, this->textures){
		Texture *tex = Texture::fromDict(lnk);
		uint32 sz = tex->streamGetSizeNative();
		sz += 12 + Texture::s_plglist.streamGetSize(tex);
		writeChunkHeader(stream, ID_TEXTURENATIVE, sz);
		tex->streamWriteNative(stream);
		Texture::s_plglist.streamWrite(stream, tex);
	}
	s_plglist.streamWrite(stream, this);
}